

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<2,_2,_9,_2,_3>::evaluate
               (ShaderEvalContext *evalCtx)

{
  float *pfVar1;
  Vector<float,_3> *pVVar2;
  int row_1;
  long lVar3;
  int row;
  long lVar4;
  Vector<float,_3> *pVVar5;
  int col;
  long lVar6;
  float v;
  float fVar7;
  undefined1 auVar8 [16];
  bool bVar10;
  undefined4 uVar11;
  Vector<float,_3> res;
  undefined8 local_50;
  float local_48;
  int aiStack_40 [6];
  Mat3 m;
  long lVar9;
  
  pfVar1 = (float *)&m;
  lVar3 = 0;
  lVar4 = 0;
  do {
    lVar6 = 0;
    auVar8 = _DAT_019f34d0;
    do {
      bVar10 = SUB164(auVar8 ^ _DAT_019ec5b0,4) == -0x80000000 &&
               SUB164(auVar8 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
      if (bVar10) {
        uVar11 = 0x3f800000;
        if (lVar3 != lVar6) {
          uVar11 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar6) = uVar11;
      }
      if (bVar10) {
        uVar11 = 0x3f800000;
        if (lVar3 + -0xc != lVar6) {
          uVar11 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar6 + 0xc) = uVar11;
      }
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar9 + 2;
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x30);
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 0xc;
    pfVar1 = pfVar1 + 1;
  } while (lVar4 != 3);
  pVVar2 = (Vector<float,_3> *)&m;
  m.m_data.m_data[0].m_data[0] = evalCtx->in[0].m_data[0];
  m.m_data.m_data[0].m_data[1] = evalCtx->in[0].m_data[1];
  m.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
  m.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
  m.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
  m.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
  m.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
  local_50 = *(undefined8 *)(evalCtx->coords).m_data;
  local_48 = (evalCtx->coords).m_data[2];
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  lVar3 = 0;
  do {
    fVar7 = 0.0;
    lVar4 = 0;
    pVVar5 = pVVar2;
    do {
      fVar7 = fVar7 + ((Vector<tcu::Vector<float,_3>,_3> *)pVVar5->m_data)->m_data[0].m_data[0] *
                      *(float *)((long)&local_50 + lVar4 * 4);
      lVar4 = lVar4 + 1;
      pVVar5 = pVVar5 + 1;
    } while (lVar4 != 3);
    res.m_data[lVar3] = fVar7;
    lVar3 = lVar3 + 1;
    pVVar2 = (Vector<float,_3> *)(pVVar2->m_data + 1);
  } while (lVar3 != 3);
  aiStack_40[2] = 0;
  aiStack_40[3] = 1;
  aiStack_40[4] = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[aiStack_40[lVar3]] = res.m_data[lVar3 + -2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) * getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}